

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  istream *piVar4;
  ostream *poVar5;
  uchar *in_RCX;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *extraout_RDX_03;
  size_t *siglen;
  size_t *siglen_00;
  char *sig;
  size_t in_R8;
  string local_48 [8];
  string turn;
  int dy;
  int dx;
  int E;
  int TY;
  int TX;
  int LY;
  int LX;
  
  LY = 0;
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&TX);
  piVar4 = (istream *)std::istream::operator>>(piVar4,&TY);
  piVar4 = (istream *)std::istream::operator>>(piVar4,&E);
  std::istream::operator>>(piVar4,&dx);
  std::istream::ignore();
  do {
    sig = (char *)&dy;
    std::istream::operator>>((istream *)&std::cin,(int *)sig);
    std::istream::ignore();
    uVar1 = TX - E;
    uVar2 = TY - dx;
    std::__cxx11::string::string(local_48);
    if ((int)uVar2 < 0) {
      sig = "N";
      std::__cxx11::string::operator+=(local_48,"N");
      siglen = extraout_RDX_00;
    }
    else {
      siglen = extraout_RDX;
      if (0 < (int)uVar2) {
        sig = "S";
        std::__cxx11::string::operator+=(local_48,"S");
        siglen = extraout_RDX_01;
      }
    }
    if ((int)uVar1 < 1) {
      if ((int)uVar1 < 0) {
        sig = "W";
        std::__cxx11::string::operator+=(local_48,"W");
        siglen = extraout_RDX_03;
      }
    }
    else {
      sig = "E";
      std::__cxx11::string::operator+=(local_48,"E");
      siglen = extraout_RDX_02;
    }
    uVar3 = sign((EVP_PKEY_CTX *)(ulong)uVar1,(uchar *)sig,siglen,in_RCX,in_R8);
    E = E + uVar3;
    uVar3 = sign((EVP_PKEY_CTX *)(ulong)uVar2,(uchar *)sig,siglen_00,(uchar *)(ulong)uVar3,in_R8);
    in_RCX = (uchar *)(ulong)uVar3;
    dx = dx + uVar3;
    poVar5 = std::operator<<((ostream *)&std::cerr,"dx = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
    poVar5 = std::operator<<(poVar5,", dy =");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,local_48);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_48);
  } while( true );
}

Assistant:

int main()
{
    int LX; // the X position of the light of power
    int LY; // the Y position of the light of power
    int TX; // Thor's starting X position
    int TY; // Thor's starting Y position
    cin >> LX >> LY >> TX >> TY; cin.ignore();

    // game loop
    while (1)
    {
        int E; // The level of Thor's remaining energy, representing the number of moves he can still make.
        cin >> E;
        cin.ignore();

        // Write an action using cout. DON'T FORGET THE "<< endl"
        // To debug: cerr << "Debug messages..." << endl;
        int dx = LX - TX;
        int dy = LY - TY;
        std::string turn;
        if (0 > dy)
        {
            turn += "N";
        } else if (0 < dy)
        {
            turn += "S";
        }
        if (0 < dx)
        {
            turn += "E";
        } else if (0 > dx)
        {
            turn += "W";
        }
        TX += sign(dx);
        TY += sign(dy);
        std::cerr << "dx = " << dx << ", dy =" << dy << std::endl;

        cout << turn << endl; // A single line providing the move to be made: N NE E SE S SW W or NW
    }
}